

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateUTest.hpp
# Opt level: O3

void Qentem::Test::TestLoopUTag1(QTest *test)

{
  SizeT *pSVar1;
  Value<char16_t> *pVVar2;
  long lVar3;
  TagBit *pTVar4;
  undefined8 uVar5;
  char16_t *pcVar6;
  QTest *pQVar7;
  uint uVar8;
  Value<char16_t> *pVVar9;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 *paVar10;
  long lVar11;
  Value<char16_t> value1;
  Array<Qentem::Tags::TagBit> tags_cache_5;
  Value<char16_t> value2;
  StringStream<char16_t> ss;
  Value<char16_t> value3;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_e8;
  char local_d8;
  Array<Qentem::Tags::TagBit> local_c8;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_b8;
  char local_a8;
  StringStream<char16_t> local_98;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_88;
  undefined8 local_78;
  char16_t *local_70;
  SizeT local_68;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_58;
  char local_48;
  QTest *local_38;
  
  local_d8 = 0;
  local_48 = '\0';
  local_98.storage_ = (char16_t *)0x0;
  local_98.length_ = 0;
  local_98.capacity_ = 0;
  local_e8.array_.storage_ = (Value<char16_t> *)0x0;
  local_e8._8_8_ = 0;
  local_58.array_.storage_ = (Value<char16_t> *)0x0;
  local_58._8_8_ = 0;
  Value<char16_t>::reset((Value<char16_t> *)&local_e8.array_);
  local_d8 = '\x03';
  local_88.number_ = (QNumber64)0x64;
  local_78 = CONCAT71(local_78._1_7_,6);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_e8.array_,(Value<char16_t> *)&local_88.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_88.array_);
  if (local_d8 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_e8.array_);
    local_d8 = '\x03';
  }
  local_88.number_ = (QNumber64)0xffffffffffffffce;
  local_78 = CONCAT71(local_78._1_7_,6);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_e8.array_,(Value<char16_t> *)&local_88.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_88.array_);
  String<char16_t>::String((String<char16_t> *)&local_b8.array_,L"Qentem");
  if (local_d8 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_e8.array_);
    local_d8 = '\x03';
  }
  local_88.array_.storage_ = local_b8.array_.storage_;
  local_88.array_.index_ = local_b8.array_.index_;
  local_b8._8_8_ = local_b8._8_8_ & 0xffffffff00000000;
  local_b8.array_.storage_ = (Value<char16_t> *)0x0;
  local_78 = CONCAT71(local_78._1_7_,4);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_e8.array_,(Value<char16_t> *)&local_88.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_88.array_);
  uVar5 = local_b8.array_.storage_;
  if (local_b8.array_.storage_ != (Value<char16_t> *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_b8.number_);
  }
  operator_delete((void *)uVar5);
  if (local_d8 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_e8.array_);
    local_d8 = '\x03';
  }
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_78 = CONCAT71(local_78._1_7_,8);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_e8.array_,(Value<char16_t> *)&local_88.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_88.array_);
  if (local_d8 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_e8.array_);
    local_d8 = '\x03';
  }
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_78 = CONCAT71(local_78._1_7_,9);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_e8.array_,(Value<char16_t> *)&local_88.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_88.array_);
  if (local_d8 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_e8.array_);
    local_d8 = '\x03';
  }
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_78 = CONCAT71(local_78._1_7_,10);
  local_38 = test;
  Array<Qentem::Value<char16_t>_>::operator+=(&local_e8.array_,(Value<char16_t> *)&local_88.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_88.array_);
  if (local_d8 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_e8.array_);
    local_d8 = '\x03';
  }
  local_88.number_ = (QNumber64)0x3;
  local_78 = CONCAT71(local_78._1_7_,6);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_e8.array_,(Value<char16_t> *)&local_88.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_88.array_);
  local_78 = 0;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_70 = L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_b8.array_.storage_ = (Value<char16_t> *)0x0;
  local_b8._8_8_ = 0;
  local_68 = 0x34;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>",0x34,
             (Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,(Array<Qentem::Tags::TagBit> *)&local_b8.array_,
             (Value<char16_t> *)&local_e8.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  pQVar7 = local_38;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[41]>
            (local_38,&local_98,(char16_t (*) [41])L"100, -50, Qentem, true, false, null, 3, ",0xb19
            );
  local_78 = 0;
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_70 = L"<loop value    =    \"loop1-value\">{var:loop1-value}, {var:loop1-value} </loop>";
  local_68 = 0x4e;
  local_b8.array_.storage_ = (Value<char16_t> *)0x0;
  local_b8._8_8_ = 0;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value    =    \"loop1-value\">{var:loop1-value}, {var:loop1-value} </loop>",
             0x4e,(Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,(Array<Qentem::Tags::TagBit> *)&local_b8.array_,
             (Value<char16_t> *)&local_e8.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[74]>
            (pQVar7,&local_98,
             (char16_t (*) [74])
             L"100, 100 -50, -50 Qentem, Qentem true, true false, false null, null 3, 3 ",0xb1e);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  Value<char16_t>::reset((Value<char16_t> *)&local_e8.array_);
  local_d8 = 0;
  Value<char16_t>::reset((Value<char16_t> *)&local_e8.array_);
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_d8 = '\x03';
  local_78 = CONCAT71(local_78._1_7_,6);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_e8.array_,(Value<char16_t> *)&local_88.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_88.array_);
  if (local_d8 != '\x03') {
    Value<char16_t>::reset((Value<char16_t> *)&local_e8.array_);
    local_d8 = '\x03';
  }
  local_88.number_ = (QNumber64)0x1;
  local_78 = CONCAT71(local_78._1_7_,6);
  Array<Qentem::Value<char16_t>_>::operator+=(&local_e8.array_,(Value<char16_t> *)&local_88.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_88.array_);
  lVar11 = 0;
  do {
    lVar3 = lVar11 + 1;
    lVar11 = lVar11 + 1;
  } while (L"<loop value=\"loop1-value\"><loop value=\"loop2-value\">({var:loop1-value}: {var:loop2-value}) </loop></loop>"
           [lVar3] != L'\0');
  local_b8.array_.storage_ = (Value<char16_t> *)0x0;
  local_b8._8_8_ = 0;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = 
  L"<loop value=\"loop1-value\"><loop value=\"loop2-value\">({var:loop1-value}: {var:loop2-value}) </loop></loop>"
  ;
  local_68 = (SizeT)lVar11;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\"loop1-value\"><loop value=\"loop2-value\">({var:loop1-value}: {var:loop2-value}) </loop></loop>"
             ,local_68,(Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,(Array<Qentem::Tags::TagBit> *)&local_b8.array_,
             (Value<char16_t> *)&local_e8.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  pQVar7 = local_38;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[29]>
            (local_38,&local_98,(char16_t (*) [29])L"(0: 0) (0: 1) (1: 0) (1: 1) ",0xb29);
  lVar11 = 0;
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  do {
    lVar3 = lVar11 + 1;
    lVar11 = lVar11 + 1;
  } while (L"<loop value=\"loop1-value\"><loop value=\"loop2-value\"><loop\n                 value=\"loop3-value\">({var:loop1-value}: {var:loop2-value}: {var:loop3-value}) </loop></loop></loop>"
           [lVar3] != L'\0');
  local_b8.array_.storage_ = (Value<char16_t> *)0x0;
  local_b8._8_8_ = 0;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = 
  L"<loop value=\"loop1-value\"><loop value=\"loop2-value\"><loop\n                 value=\"loop3-value\">({var:loop1-value}: {var:loop2-value}: {var:loop3-value}) </loop></loop></loop>"
  ;
  local_68 = (SizeT)lVar11;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\"loop1-value\"><loop value=\"loop2-value\"><loop\n                 value=\"loop3-value\">({var:loop1-value}: {var:loop2-value}: {var:loop3-value}) </loop></loop></loop>"
             ,local_68,(Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,(Array<Qentem::Tags::TagBit> *)&local_b8.array_,
             (Value<char16_t> *)&local_e8.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[81]>
            (pQVar7,&local_98,
             (char16_t (*) [81])
             L"(0: 0: 0) (0: 0: 1) (0: 1: 0) (0: 1: 1) (1: 0: 0) (1: 0: 1) (1: 1: 0) (1: 1: 1) ",
             0xb2f);
  lVar11 = 0;
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  do {
    lVar3 = lVar11 + 1;
    lVar11 = lVar11 + 1;
  } while (L"<loop value=\'loop1-value\'><loop value=\'loop2-value\'><loop\n                 value=\'loop3-value\'><loop value=\'loop4-value\'>({var:loop1-value}: {var:loop2-value}: {var:loop3-value}: {var:loop4-value}) </loop></loop></loop></loop>"
           [lVar3] != L'\0');
  local_b8.array_.storage_ = (Value<char16_t> *)0x0;
  local_b8._8_8_ = 0;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = 
  L"<loop value=\'loop1-value\'><loop value=\'loop2-value\'><loop\n                 value=\'loop3-value\'><loop value=\'loop4-value\'>({var:loop1-value}: {var:loop2-value}: {var:loop3-value}: {var:loop4-value}) </loop></loop></loop></loop>"
  ;
  local_68 = (SizeT)lVar11;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\'loop1-value\'><loop value=\'loop2-value\'><loop\n                 value=\'loop3-value\'><loop value=\'loop4-value\'>({var:loop1-value}: {var:loop2-value}: {var:loop3-value}: {var:loop4-value}) </loop></loop></loop></loop>"
             ,local_68,(Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,(Array<Qentem::Tags::TagBit> *)&local_b8.array_,
             (Value<char16_t> *)&local_e8.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array((Array<Qentem::Tags::TagBit> *)&local_b8.array_);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[209]>
            (pQVar7,&local_98,
             (char16_t (*) [209])
             L"(0: 0: 0: 0) (0: 0: 0: 1) (0: 0: 1: 0) (0: 0: 1: 1) (0: 1: 0: 0) (0: 1: 0: 1) (0: 1: 1: 0) (0: 1: 1: 1) (1: 0: 0: 0) (1: 0: 0: 1) (1: 0: 1: 0) (1: 0: 1: 1) (1: 1: 0: 0) (1: 1: 0: 1) (1: 1: 1: 0) (1: 1: 1: 1) "
             ,0xb37);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_b8.array_.storage_ = (Value<char16_t> *)0x0;
  local_b8._8_8_ = 0;
  JSON::JSONParser<char16_t,_Qentem::StringStream<char16_t>_>::Parse
            ((ValueT *)&local_88.array_,(StringStream<char16_t> *)&local_b8.array_,
             L"[100, -50, \"A\", true, false, null]",0x22);
  uVar5 = local_b8.array_.storage_;
  if (local_b8.array_.storage_ != (Value<char16_t> *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_b8.number_);
  }
  operator_delete((void *)uVar5);
  Value<char16_t>::operator=
            ((Value<char16_t> *)&local_e8.array_,(Value<char16_t> *)&local_88.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_88.array_);
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  JSON::JSONParser<char16_t,_Qentem::StringStream<char16_t>_>::Parse
            ((ValueT *)&local_b8.array_,(StringStream<char16_t> *)&local_88.array_,
             L"{\"k-1\": 4, \"k-2\":1.5, \"k-3\":\"ABC\", \"k-4\":true, \"k-5\":false, \"k-6\":null}"
             ,0x47);
  uVar5 = local_88.array_.storage_;
  if (local_88.array_.storage_ != (Value<char16_t> *)0x0) {
    MemoryRecord::RemoveAllocation((void *)local_88.number_);
  }
  operator_delete((void *)uVar5);
  if (local_48 != '\x02') {
    Value<char16_t>::reset((Value<char16_t> *)&local_58.array_);
    local_48 = '\x02';
  }
  pVVar9 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_58.array_
                      ,L"arr1",4);
  if (&pVVar9->field_0 != &local_e8) {
    Value<char16_t>::reset(pVVar9);
    Value<char16_t>::copyValue(pVVar9,(Value<char16_t> *)&local_e8.array_);
  }
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_78 = 0;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_70 = L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_68 = 0x34;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>",0x34,&local_c8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,&local_c8,(Value<char16_t> *)&local_e8.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  pQVar7 = local_38;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (local_38,&local_98,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb44);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_78 = 0;
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_70 = L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_68 = 0x34;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>",0x34,&local_c8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,&local_c8,(Value<char16_t> *)&local_b8.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (pQVar7,&local_98,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb48);
  local_78 = 0;
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_70 = L"<loop set=\"arr1\" value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_68 = 0x3f;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop set=\"arr1\" value=\"loop1-value\">{var:loop1-value}, </loop>",0x3f,&local_c8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,&local_c8,(Value<char16_t> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (pQVar7,&local_98,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb4c);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  if (local_48 != '\x02') {
    Value<char16_t>::reset((Value<char16_t> *)&local_58.array_);
    local_48 = '\x02';
  }
  paVar10 = &HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                       ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)
                        &local_58.array_,L"arr1",4)->field_0;
  if (paVar10 != &local_b8) {
    Value<char16_t>::reset((Value<char16_t> *)&paVar10->array_);
    Value<char16_t>::copyValue
              ((Value<char16_t> *)&paVar10->array_,(Value<char16_t> *)&local_b8.array_);
  }
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = L"<loop set=\"arr1\" value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_68 = 0x3f;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop set=\"arr1\" value=\"loop1-value\">{var:loop1-value}, </loop>",0x3f,&local_c8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,&local_c8,(Value<char16_t> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (local_38,&local_98,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb52);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  if (local_48 != '\x02') {
    Value<char16_t>::reset((Value<char16_t> *)&local_58.array_);
    local_48 = '\x02';
  }
  pVVar9 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_58.array_
                      ,L"arr1",4);
  if (&pVVar9->field_0 != &local_e8) {
    Value<char16_t>::reset(pVVar9);
    Value<char16_t>::copyValue(pVVar9,(Value<char16_t> *)&local_e8.array_);
  }
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_78 = 0;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_70 = L"<loop value=\"loop1-value\" >{var:loop1-value}, </loop>";
  local_68 = 0x35;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\"loop1-value\" >{var:loop1-value}, </loop>",0x35,&local_c8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,&local_c8,(Value<char16_t> *)&local_e8.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  pQVar7 = local_38;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (local_38,&local_98,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb59);
  local_78 = 0;
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_70 = L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_68 = 0x34;
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\"loop1-value\">{var:loop1-value}, </loop>",0x34,&local_c8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,&local_c8,(Value<char16_t> *)&local_b8.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (pQVar7,&local_98,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb5d);
  local_78 = 0;
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_70 = L"<loop value=\"loop1-value\"set=\"arr1\">{var:loop1-value}, </loop>";
  local_68 = 0x3e;
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\"loop1-value\"set=\"arr1\">{var:loop1-value}, </loop>",0x3e,&local_c8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,&local_c8,(Value<char16_t> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (pQVar7,&local_98,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb61);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  if (local_48 != '\x02') {
    Value<char16_t>::reset((Value<char16_t> *)&local_58.array_);
    local_48 = '\x02';
  }
  paVar10 = &HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                       ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)
                        &local_58.array_,L"arr1",4)->field_0;
  if (paVar10 != &local_b8) {
    Value<char16_t>::reset((Value<char16_t> *)&paVar10->array_);
    Value<char16_t>::copyValue
              ((Value<char16_t> *)&paVar10->array_,(Value<char16_t> *)&local_b8.array_);
  }
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = L"<loop set=\'arr1\' value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_68 = 0x3f;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop set=\'arr1\' value=\"loop1-value\">{var:loop1-value}, </loop>",0x3f,&local_c8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,&local_c8,(Value<char16_t> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  pQVar7 = local_38;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (local_38,&local_98,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb67);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  Value<char16_t>::reset((Value<char16_t> *)&local_58.array_);
  local_48 = 0;
  Value<char16_t>::reset((Value<char16_t> *)&local_58.array_);
  local_48 = 2;
  pVVar9 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_58.array_
                      ,L"arr1",4);
  if (pVVar9->type_ != Object) {
    Value<char16_t>::reset(pVVar9);
    pVVar9->type_ = Object;
  }
  pVVar9 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)pVVar9,L"arr2",4
                     );
  if (pVVar9->type_ != Object) {
    Value<char16_t>::reset(pVVar9);
    pVVar9->type_ = Object;
  }
  pVVar9 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)pVVar9,L"arr3",4
                     );
  if (&pVVar9->field_0 != &local_e8) {
    Value<char16_t>::reset(pVVar9);
    Value<char16_t>::copyValue(pVVar9,(Value<char16_t> *)&local_e8.array_);
  }
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = L"<loop set=\"arr1[arr2][arr3]\" value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_68 = 0x4b;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop set=\"arr1[arr2][arr3]\" value=\"loop1-value\">{var:loop1-value}, </loop>",0x4b
             ,&local_c8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,&local_c8,(Value<char16_t> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (pQVar7,&local_98,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb6f);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  Value<char16_t>::reset((Value<char16_t> *)&local_58.array_);
  local_48 = 0;
  pVVar9 = Value<char16_t>::operator[]((Value<char16_t> *)&local_58.array_,0);
  pVVar9 = Value<char16_t>::operator[](pVVar9,0);
  if (pVVar9->type_ == Array) {
LAB_0011842e:
    uVar8 = (pVVar9->field_0).array_.index_;
    if (uVar8 == (pVVar9->field_0).array_.capacity_) {
      Array<Qentem::Value<char16_t>_>::resize
                ((Array<Qentem::Value<char16_t>_> *)pVVar9,(uVar8 == 0 | uVar8) * 2);
      uVar8 = (pVVar9->field_0).array_.index_;
    }
    pVVar2 = (pVVar9->field_0).array_.storage_ + uVar8;
    (pVVar2->field_0).array_.storage_ = (Value<char16_t> *)0x0;
    *(SizeT *)((long)&pVVar2->field_0 + 8) = 0;
    *(SizeT *)((long)&pVVar2->field_0 + 0xc) = 0;
    pVVar2->type_ = Undefined;
    Value<char16_t>::copyValue(pVVar2,(Value<char16_t> *)&local_b8.array_);
    pSVar1 = &(pVVar9->field_0).array_.index_;
    *pSVar1 = *pSVar1 + 1;
  }
  else {
    if ((pVVar9->type_ != Object) || (local_a8 != '\x02')) {
      Value<char16_t>::reset(pVVar9);
      pVVar9->type_ = Array;
      goto LAB_0011842e;
    }
    HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::operator+=
              ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)pVVar9,
               (HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_b8.array_);
  }
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = L"<loop set=\"0[0][0]\"value=\"loop1-value\">{var:loop1-value}, </loop>";
  local_68 = 0x41;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop set=\"0[0][0]\"value=\"loop1-value\">{var:loop1-value}, </loop>",0x41,&local_c8
            );
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,&local_c8,(Value<char16_t> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (pQVar7,&local_98,(char16_t (*) [33])L"4, 1.5, ABC, true, false, null, ",0xb76);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  Value<char16_t>::reset((Value<char16_t> *)&local_58.array_);
  local_48 = 0;
  Value<char16_t>::reset((Value<char16_t> *)&local_58.array_);
  local_48 = 2;
  pVVar9 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_58.array_
                      ,L"k1",2);
  pVVar9 = Value<char16_t>::operator[](pVVar9,0);
  if (pVVar9->type_ != Object) {
    Value<char16_t>::reset(pVVar9);
    pVVar9->type_ = Object;
  }
  pVVar9 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)pVVar9,L"k3",2);
  if (&pVVar9->field_0 != &local_e8) {
    Value<char16_t>::reset(pVVar9);
    Value<char16_t>::copyValue(pVVar9,(Value<char16_t> *)&local_e8.array_);
  }
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = L"<loop value=\"loop1-value\" set=\"k1[0][k3]\">{var:loop1-value}, </loop>";
  local_68 = 0x44;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop value=\"loop1-value\" set=\"k1[0][k3]\">{var:loop1-value}, </loop>",0x44,
             &local_c8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,&local_c8,(Value<char16_t> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[33]>
            (pQVar7,&local_98,(char16_t (*) [33])L"100, -50, A, true, false, null, ",0xb7d);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  Value<char16_t>::reset((Value<char16_t> *)&local_58.array_);
  local_48 = 0;
  pVVar9 = Value<char16_t>::operator[]((Value<char16_t> *)&local_58.array_,0);
  if (pVVar9->type_ != Object) {
    Value<char16_t>::reset(pVVar9);
    pVVar9->type_ = Object;
  }
  pVVar9 = HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::Get
                     ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)pVVar9,L"k2",2);
  if (pVVar9->type_ != Array) {
    if ((pVVar9->type_ == Object) && (local_a8 == '\x02')) {
      HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>::operator+=
                ((HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)pVVar9,
                 (HArray<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *)&local_b8.array_);
      goto LAB_001186bf;
    }
    Value<char16_t>::reset(pVVar9);
    pVVar9->type_ = Array;
  }
  uVar8 = (pVVar9->field_0).array_.index_;
  if (uVar8 == (pVVar9->field_0).array_.capacity_) {
    Array<Qentem::Value<char16_t>_>::resize
              ((Array<Qentem::Value<char16_t>_> *)pVVar9,(uVar8 == 0 | uVar8) * 2);
    uVar8 = (pVVar9->field_0).array_.index_;
  }
  pVVar2 = (pVVar9->field_0).array_.storage_ + uVar8;
  (pVVar2->field_0).array_.storage_ = (Value<char16_t> *)0x0;
  *(SizeT *)((long)&pVVar2->field_0 + 8) = 0;
  *(SizeT *)((long)&pVVar2->field_0 + 0xc) = 0;
  pVVar2->type_ = Undefined;
  Value<char16_t>::copyValue(pVVar2,(Value<char16_t> *)&local_b8.array_);
  pSVar1 = &(pVVar9->field_0).array_.index_;
  *pSVar1 = *pSVar1 + 1;
LAB_001186bf:
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  local_70 = 
  L"<loop set=\"0[k2][0]\"value=\"loop1-value\">{var:loop1-value}, {var:loop1-value}, </loop>";
  local_68 = 0x55;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop set=\"0[k2][0]\"value=\"loop1-value\">{var:loop1-value}, {var:loop1-value}, </loop>"
             ,0x55,&local_c8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,&local_c8,(Value<char16_t> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[65]>
            (pQVar7,&local_98,
             (char16_t (*) [65])L"4, 4, 1.5, 1.5, ABC, ABC, true, true, false, false, null, null, ",
             0xb85);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  JSON::JSONParser<char16_t,_Qentem::StringStream<char16_t>_>::Parse
            ((ValueT *)&local_88.array_,(StringStream<char16_t> *)&local_c8,
             L"{\"group\":[[10],[20],[30]]}",0x1a);
  pTVar4 = local_c8.storage_;
  if (local_c8.storage_ != (TagBit *)0x0) {
    MemoryRecord::RemoveAllocation(local_c8.storage_);
  }
  operator_delete(pTVar4);
  Value<char16_t>::operator=
            ((Value<char16_t> *)&local_58.array_,(Value<char16_t> *)&local_88.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_88.array_);
  local_78 = 0;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_70 = 
  L"<loop set=\"group\" value=\"Val_1\"><loop set=\"Val_1\" value=\"Val_2\">{var:Val_2}</loop></loop>"
  ;
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_68 = 0x59;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop set=\"group\" value=\"Val_1\"><loop set=\"Val_1\" value=\"Val_2\">{var:Val_2}</loop></loop>"
             ,0x59,&local_c8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,&local_c8,(Value<char16_t> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (pQVar7,&local_98,(char16_t (*) [7])L"102030",0xb8b);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  JSON::JSONParser<char16_t,_Qentem::StringStream<char16_t>_>::Parse
            ((ValueT *)&local_88.array_,(StringStream<char16_t> *)&local_c8,L"{\"group\":[1,2,3,4]}"
             ,0x13);
  pTVar4 = local_c8.storage_;
  if (local_c8.storage_ != (TagBit *)0x0) {
    MemoryRecord::RemoveAllocation(local_c8.storage_);
  }
  operator_delete(pTVar4);
  Value<char16_t>::operator=
            ((Value<char16_t> *)&local_58.array_,(Value<char16_t> *)&local_88.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_88.array_);
  local_78 = 0;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_70 = L"<loop set=\"group\" value=\"Val_\">{var:Val_}</loop>";
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_68 = 0x30;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop set=\"group\" value=\"Val_\">{var:Val_}</loop>",0x30,&local_c8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,&local_c8,(Value<char16_t> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (pQVar7,&local_98,(char16_t (*) [5])L"1234",0xb91);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  JSON::JSONParser<char16_t,_Qentem::StringStream<char16_t>_>::Parse
            ((ValueT *)&local_88.array_,(StringStream<char16_t> *)&local_c8,
             L"{\"numbers\":[1,2,3,4,5,6,7,8]}",0x1d);
  pTVar4 = local_c8.storage_;
  if (local_c8.storage_ != (TagBit *)0x0) {
    MemoryRecord::RemoveAllocation(local_c8.storage_);
  }
  operator_delete(pTVar4);
  Value<char16_t>::operator=
            ((Value<char16_t> *)&local_58.array_,(Value<char16_t> *)&local_88.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_88.array_);
  local_78 = 0;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_70 = L"A<loop set=\"numbers\" value=\"l_id1\">{var:l_id1}</loop>B";
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  local_68 = 0x36;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"A<loop set=\"numbers\" value=\"l_id1\">{var:l_id1}</loop>B",0x36,&local_c8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,&local_c8,(Value<char16_t> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (pQVar7,&local_98,(char16_t (*) [11])L"A12345678B",0xb96);
  local_78 = 0;
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  local_88.array_.storage_ = (Value<char16_t> *)0x0;
  local_88._8_8_ = 0;
  local_70 = L"<loop set=\"numbers\" value=\"l_id1\">{var:l_id1[0]}</loop>";
  local_68 = 0x37;
  local_c8.storage_ = (TagBit *)0x0;
  local_c8.index_ = 0;
  local_c8.capacity_ = 0;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"<loop set=\"numbers\" value=\"l_id1\">{var:l_id1[0]}</loop>",0x37,&local_c8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_88.array_,&local_c8,(Value<char16_t> *)&local_58.array_,&local_98);
  Array<Qentem::Tags::TagBit>::~Array(&local_c8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[113]>
            (pQVar7,&local_98,
             (char16_t (*) [113])
             L"{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}"
             ,0xb9d);
  local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
  Value<char16_t>::~Value((Value<char16_t> *)&local_b8.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_58.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_e8.array_);
  pcVar6 = local_98.storage_;
  if (local_98.storage_ != (char16_t *)0x0) {
    MemoryRecord::RemoveAllocation(local_98.storage_);
  }
  operator_delete(pcVar6);
  return;
}

Assistant:

static void TestLoopUTag1(QTest &test) {
    StringStream<char16_t> ss;
    Value<char16_t>        value1;
    Value<char16_t>        value3;
    const char16_t        *content;

    value1 += 100;
    value1 += -50;
    value1 += uR"(Qentem)";
    value1 += true;
    value1 += false;
    value1 += nullptr;
    value1 += 3;

    content = uR"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value1, ss), uR"(100, -50, Qentem, true, false, null, 3, )", __LINE__);
    ss.Clear();

    content = uR"(<loop value    =    "loop1-value">{var:loop1-value}, {var:loop1-value} </loop>)";
    test.IsEqual(Template::Render(content, value1, ss),
                 uR"(100, 100 -50, -50 Qentem, Qentem true, true false, false null, null 3, 3 )", __LINE__);
    ss.Clear();

    ////////////////

    value1.Reset();
    value1 += 0;
    value1 += 1;

    content =
        uR"(<loop value="loop1-value"><loop value="loop2-value">({var:loop1-value}: {var:loop2-value}) </loop></loop>)";
    test.IsEqual(Template::Render(content, value1, ss), uR"((0: 0) (0: 1) (1: 0) (1: 1) )", __LINE__);
    ss.Clear();

    content = uR"(<loop value="loop1-value"><loop value="loop2-value"><loop
                 value="loop3-value">({var:loop1-value}: {var:loop2-value}: {var:loop3-value}) </loop></loop></loop>)";
    test.IsEqual(Template::Render(content, value1, ss),
                 uR"((0: 0: 0) (0: 0: 1) (0: 1: 0) (0: 1: 1) (1: 0: 0) (1: 0: 1) (1: 1: 0) (1: 1: 1) )", __LINE__);
    ss.Clear();

    content = uR"(<loop value='loop1-value'><loop value='loop2-value'><loop
                 value='loop3-value'><loop value='loop4-value'>({var:loop1-value}: {var:loop2-value}: {var:loop3-value}: {var:loop4-value}) </loop></loop></loop></loop>)";
    test.IsEqual(
        Template::Render(content, value1, ss),
        uR"((0: 0: 0: 0) (0: 0: 0: 1) (0: 0: 1: 0) (0: 0: 1: 1) (0: 1: 0: 0) (0: 1: 0: 1) (0: 1: 1: 0) (0: 1: 1: 1) (1: 0: 0: 0) (1: 0: 0: 1) (1: 0: 1: 0) (1: 0: 1: 1) (1: 1: 0: 0) (1: 1: 0: 1) (1: 1: 1: 0) (1: 1: 1: 1) )",
        __LINE__);
    ss.Clear();

    //////////////////////

    value1 = JSON::Parse(uR"([100, -50, "A", true, false, null])");
    const Value<char16_t> value2 =
        JSON::Parse(uR"({"k-1": 4, "k-2":1.5, "k-3":"ABC", "k-4":true, "k-5":false, "k-6":null})");

    //////////////////////
    value3[uR"(arr1)"] = value1;

    content = uR"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value1, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    content = uR"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value2, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    content = uR"(<loop set="arr1" value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3[uR"(arr1)"] = value2;

    content = uR"(<loop set="arr1" value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    //////////////////////
    value3[uR"(arr1)"] = value1;

    content = uR"(<loop value="loop1-value" >{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value1, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    content = uR"(<loop value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value2, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    content = uR"(<loop value="loop1-value"set="arr1">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3[uR"(arr1)"] = value2;

    content = uR"(<loop set='arr1' value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    //////////////////////
    value3.Reset();
    value3[uR"(arr1)"][uR"(arr2)"][uR"(arr3)"] = value1;

    content = uR"(<loop set="arr1[arr2][arr3]" value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3.Reset();
    value3[0][0] += value2;

    content = uR"(<loop set="0[0][0]"value="loop1-value">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(4, 1.5, ABC, true, false, null, )", __LINE__);
    ss.Clear();

    value3.Reset();
    value3[uR"(k1)"][0][uR"(k3)"] = value1;

    content = uR"(<loop value="loop1-value" set="k1[0][k3]">{var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(100, -50, A, true, false, null, )", __LINE__);
    ss.Clear();

    value3.Reset();
    value3[0][uR"(k2)"] += value2;

    content = uR"(<loop set="0[k2][0]"value="loop1-value">{var:loop1-value}, {var:loop1-value}, </loop>)";
    test.IsEqual(Template::Render(content, value3, ss),
                 uR"(4, 4, 1.5, 1.5, ABC, ABC, true, true, false, false, null, null, )", __LINE__);
    ss.Clear();

    value3 = JSON::Parse(uR"({"group":[[10],[20],[30]]})");

    content = uR"(<loop set="group" value="Val_1"><loop set="Val_1" value="Val_2">{var:Val_2}</loop></loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(102030)", __LINE__);
    ss.Clear();

    value3 = JSON::Parse(uR"({"group":[1,2,3,4]})");

    content = uR"(<loop set="group" value="Val_">{var:Val_}</loop>)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(1234)", __LINE__);
    ss.Clear();

    value3  = JSON::Parse(uR"({"numbers":[1,2,3,4,5,6,7,8]})");
    content = uR"(A<loop set="numbers" value="l_id1">{var:l_id1}</loop>B)";
    test.IsEqual(Template::Render(content, value3, ss), uR"(A12345678B)", __LINE__);
    ss.Clear();

    content = uR"(<loop set="numbers" value="l_id1">{var:l_id1[0]}</loop>)";
    test.IsEqual(
        Template::Render(content, value3, ss),
        uR"({var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]}{var:l_id1[0]})",
        __LINE__);
    ss.Clear();
}